

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O3

int ranges::detail::
    variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,0ul>>,ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,1ul>>,ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,2ul>>>,true>::type_const,ranges::detail::variant_visitor<ranges::composed<ranges::composed<ranges::convert_to<double&>,ranges::detail::dereference_fn>,ranges::detail::get_datum_fn>,ranges::variant<double&,double&,double&>>,ranges::detail::indexed_element_fn>
              (long n,undefined8 *self,undefined8 *param_3)

{
  int iVar1;
  
  if (n != 0) {
    iVar1 = variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,1ul>>,ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,2ul>>>,true>::type_const,ranges::detail::variant_visitor<ranges::composed<ranges::composed<ranges::convert_to<double&>,ranges::detail::dereference_fn>,ranges::detail::get_datum_fn>,ranges::variant<double&,double&,double&>>,ranges::detail::indexed_element_fn>
                      (n + -1);
    return iVar1;
  }
  *param_3 = *self;
  param_3[1] = 0;
  return 0;
}

Assistant:

constexpr int variant_visit_(std::size_t n, Data & self, Fun fun, Proj proj = {})
        {
            return 0 == n ? ((void)invoke(fun, invoke(proj, self.head)), 0)
                          : detail::variant_visit_(
                                n - 1, self.tail, detail::move(fun), detail::move(proj));
        }